

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetPHRQHandle(ndicapi *pol)

{
  unsigned_long uVar1;
  
  uVar1 = ndiHexToUnsignedLong(pol->PhrqReply,2);
  return (int)uVar1;
}

Assistant:

ndicapiExport int ndiGetPHRQHandle(ndicapi* pol)
{
  char* dp;

  dp = pol->PhrqReply;
  return (int)ndiHexToUnsignedLong(dp, 2);
}